

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

int __thiscall
CMU462::OSDText::add_line(OSDText *this,float x,float y,string *text,size_t size,Color color)

{
  undefined4 uVar1;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  size_t local_58;
  Color CStack_50;
  undefined1 local_38 [16];
  float local_28;
  float fStack_24;
  
  _local_28 = color._8_8_;
  local_38._8_4_ = in_XMM2_Dc;
  local_38._0_8_ = color._0_8_;
  local_38._12_4_ = in_XMM2_Dd;
  local_68._8_8_ = 0;
  local_58 = 0;
  sStack_70 = 0;
  local_68._M_allocated_capacity = 0;
  CStack_50.r = 0.0;
  CStack_50.g = 0.0;
  CStack_50.b = 0.0;
  CStack_50.a = 1.0;
  local_88._0_4_ = 0;
  local_88._12_4_ = 0;
  local_88._8_4_ = y;
  local_78._M_p = (pointer)&local_68;
  local_88._4_4_ = x;
  std::__cxx11::string::_M_assign((string *)&local_78);
  CStack_50._0_8_ = local_38._0_8_;
  CStack_50.b = local_28;
  CStack_50.a = fStack_24;
  local_58 = size;
  if (this->use_hdpi == true) {
    local_58 = size * 2;
  }
  local_88._0_4_ = this->next_id;
  this->next_id = this->next_id + 1;
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::push_back
            (&this->lines,(value_type *)local_88);
  uVar1 = local_88._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  return uVar1;
}

Assistant:

int OSDText::add_line(float x, float y, string text,
                      size_t size, Color color) {
  // create new line
  OSDLine new_line = OSDLine();
  new_line.x = x;
  new_line.y = y;
  new_line.text = text;
  new_line.size = size;
  new_line.color = color;

  // handle HDPI display
  if (use_hdpi) new_line.size *= 2;

  // update id
  new_line.id = next_id;
  next_id++;

  // add line
  lines.push_back(new_line);

  return new_line.id;
}